

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_read_bufs(int add_flags)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t local_358;
  uv_buf_t local_348;
  uv_buf_t local_338;
  uv_buf_t local_328;
  char scratch [768];
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    pcVar3 = 
    "0 <= uv_fs_open(NULL, &open_req1, \"test/fixtures/lorem_ipsum.txt\", O_RDONLY | add_flags, 0, NULL)"
    ;
    uVar2 = 0xb4c;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar3 = "open_req1.result >= 0";
    uVar2 = 0xb4d;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar1 == -0x16) {
      iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                         (uv_fs_cb)0x0);
      if (iVar1 == -0x16) {
        iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&local_358,0,0,
                           (uv_fs_cb)0x0);
        if (iVar1 == -0x16) {
          local_358 = uv_buf_init(scratch,0x100);
          local_348 = uv_buf_init(scratch + 0x100,0x100);
          local_338 = uv_buf_init(scratch + 0x200,0x80);
          local_328 = uv_buf_init(scratch + 0x280,0x80);
          iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&local_358,2,0,
                             (uv_fs_cb)0x0);
          if (iVar1 == 0x1be) {
            if (read_req.result == 0x1be) {
              uv_fs_req_cleanup(&read_req);
              iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&local_338,2,
                                 0x100,(uv_fs_cb)0x0);
              if (iVar1 == 0xbe) {
                if (read_req.result == 0xbe) {
                  uv_fs_req_cleanup(&read_req);
                  pcVar3 = local_348.base;
                  iVar1 = bcmp(local_348.base,local_338.base,0x80);
                  if (iVar1 == 0) {
                    iVar1 = bcmp(pcVar3 + 0x80,local_328.base,0x3e);
                    if (iVar1 == 0) {
                      iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,
                                          (uv_fs_cb)0x0);
                      if (iVar1 == 0) {
                        if (close_req.result == 0) {
                          uv_fs_req_cleanup(&close_req);
                          return;
                        }
                        pcVar3 = "close_req.result == 0";
                        uVar2 = 0xb74;
                      }
                      else {
                        pcVar3 = "0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL)";
                        uVar2 = 0xb73;
                      }
                    }
                    else {
                      pcVar3 = "0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128)";
                      uVar2 = 0xb71;
                    }
                  }
                  else {
                    pcVar3 = "0 == memcmp(bufs[1].base + 0, bufs[2].base, 128)";
                    uVar2 = 0xb70;
                  }
                }
                else {
                  pcVar3 = "read_req.result == 190";
                  uVar2 = 0xb6d;
                }
              }
              else {
                pcVar3 = 
                "190 == uv_fs_read(NULL, &read_req, open_req1.result, bufs + 2, 2, 256, NULL)";
                uVar2 = 0xb6c;
              }
            }
            else {
              pcVar3 = "read_req.result == 446";
              uVar2 = 0xb63;
            }
          }
          else {
            pcVar3 = "446 == uv_fs_read(NULL, &read_req, open_req1.result, bufs + 0, 2, 0, NULL)";
            uVar2 = 0xb62;
          }
        }
        else {
          pcVar3 = "UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, bufs, 0, 0, NULL)";
          uVar2 = 0xb55;
        }
      }
      else {
        pcVar3 = "UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, NULL, 1, 0, NULL)";
        uVar2 = 0xb53;
      }
    }
    else {
      pcVar3 = "UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result, NULL, 0, 0, NULL)";
      uVar2 = 0xb51;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fs_read_bufs(int add_flags) {
  char scratch[768];
  uv_buf_t bufs[4];

  ASSERT(0 <= uv_fs_open(NULL, &open_req1,
                         "test/fixtures/lorem_ipsum.txt",
                         O_RDONLY | add_flags, 0, NULL));
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 0, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 1, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 bufs, 0, 0, NULL));

  bufs[0] = uv_buf_init(scratch + 0, 256);
  bufs[1] = uv_buf_init(scratch + 256, 256);
  bufs[2] = uv_buf_init(scratch + 512, 128);
  bufs[3] = uv_buf_init(scratch + 640, 128);

  ASSERT(446 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 0,
                           2,  /* 2x 256 bytes. */
                           0,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == 446);
  uv_fs_req_cleanup(&read_req);

  ASSERT(190 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 2,
                           2,  /* 2x 128 bytes. */
                           256,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == /* 446 - 256 */ 190);
  uv_fs_req_cleanup(&read_req);

  ASSERT(0 == memcmp(bufs[1].base + 0, bufs[2].base, 128));
  ASSERT(0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128));

  ASSERT(0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL));
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);
}